

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

xmlChar * xmlParseStringName(xmlParserCtxtPtr ctxt,xmlChar **str)

{
  int iVar1;
  int iVar2;
  xmlChar *__dest;
  xmlChar *pxVar3;
  uint uVar4;
  int iVar5;
  ulong __n;
  size_t sVar6;
  xmlChar *pxVar7;
  int l;
  uint local_bc;
  xmlParserCtxtPtr local_b8;
  xmlChar **local_b0;
  xmlChar buf [105];
  
  pxVar7 = *str;
  uVar4 = 10000000;
  if (((uint)ctxt->options >> 0x13 & 1) == 0) {
    uVar4 = 50000;
  }
  iVar1 = xmlStringCurrentChar(ctxt,pxVar7,&l);
  iVar2 = xmlIsNameStartChar(ctxt,iVar1);
  if (iVar2 != 0) {
    local_bc = uVar4;
    local_b0 = str;
    if (iVar1 < 0x80) {
      buf[0] = (xmlChar)iVar1;
      __n = 1;
    }
    else {
      uVar4 = xmlCopyCharMultiByte(buf,iVar1);
      __n = (ulong)uVar4;
    }
    pxVar7 = pxVar7 + l;
    iVar1 = xmlStringCurrentChar(ctxt,pxVar7,&l);
    do {
      iVar2 = xmlIsNameChar(ctxt,iVar1);
      iVar5 = (int)__n;
      if (iVar2 == 0) {
        if ((int)local_bc < iVar5) {
          xmlFatalErr(ctxt,XML_ERR_NAME_TOO_LONG,"NCName");
          return (xmlChar *)0x0;
        }
        *local_b0 = pxVar7;
        pxVar7 = xmlStrndup(buf,iVar5);
        if (pxVar7 != (xmlChar *)0x0) {
          return pxVar7;
        }
        goto LAB_0013f8dd;
      }
      if (iVar1 < 0x80) {
        uVar4 = iVar5 + 1;
        buf[iVar5] = (xmlChar)iVar1;
      }
      else {
        iVar1 = xmlCopyCharMultiByte(buf + iVar5,iVar1);
        uVar4 = iVar5 + iVar1;
      }
      __n = (ulong)uVar4;
      pxVar7 = pxVar7 + l;
      iVar1 = xmlStringCurrentChar(ctxt,pxVar7,&l);
    } while ((int)uVar4 < 100);
    sVar6 = (size_t)(uVar4 * 2);
    __dest = (xmlChar *)(*xmlMalloc)(sVar6);
    if (__dest == (xmlChar *)0x0) {
LAB_0013f8dd:
      xmlCtxtErrMemory(ctxt);
    }
    else {
      memcpy(__dest,buf,__n);
      local_b8 = ctxt;
      while( true ) {
        iVar2 = xmlIsNameChar(ctxt,iVar1);
        iVar5 = (int)__n;
        if (iVar2 == 0) {
          __dest[iVar5] = '\0';
          *local_b0 = pxVar7;
          return __dest;
        }
        iVar2 = (int)sVar6;
        pxVar3 = __dest;
        if (iVar2 < iVar5 + 10) break;
LAB_0013f85d:
        if (iVar1 < 0x80) {
          uVar4 = iVar5 + 1;
          pxVar3[iVar5] = (xmlChar)iVar1;
        }
        else {
          iVar1 = xmlCopyCharMultiByte(pxVar3 + iVar5,iVar1);
          uVar4 = iVar1 + iVar5;
        }
        ctxt = local_b8;
        __n = (ulong)uVar4;
        pxVar7 = pxVar7 + l;
        iVar1 = xmlStringCurrentChar(local_b8,pxVar7,&l);
        __dest = pxVar3;
      }
      sVar6 = 1;
      if (iVar2 < 1) {
LAB_0013f83c:
        pxVar3 = (xmlChar *)(*xmlRealloc)(__dest,sVar6);
        if (pxVar3 != (xmlChar *)0x0) goto LAB_0013f85d;
        xmlCtxtErrMemory(local_b8);
      }
      else {
        if (iVar2 < (int)local_bc) {
          uVar4 = iVar2 + 1U >> 1;
          sVar6 = (size_t)(uVar4 + iVar2);
          if ((int)(local_bc - uVar4) < iVar2) {
            sVar6 = (size_t)local_bc;
          }
          goto LAB_0013f83c;
        }
        xmlFatalErr(local_b8,XML_ERR_NAME_TOO_LONG,"NCName");
      }
      (*xmlFree)(__dest);
    }
  }
  return (xmlChar *)0x0;
}

Assistant:

static xmlChar *
xmlParseStringName(xmlParserCtxtPtr ctxt, const xmlChar** str) {
    xmlChar buf[XML_MAX_NAMELEN + 5];
    xmlChar *ret;
    const xmlChar *cur = *str;
    int len = 0, l;
    int c;
    int maxLength = (ctxt->options & XML_PARSE_HUGE) ?
                    XML_MAX_TEXT_LENGTH :
                    XML_MAX_NAME_LENGTH;

    c = CUR_SCHAR(cur, l);
    if (!xmlIsNameStartChar(ctxt, c)) {
	return(NULL);
    }

    COPY_BUF(buf, len, c);
    cur += l;
    c = CUR_SCHAR(cur, l);
    while (xmlIsNameChar(ctxt, c)) {
	COPY_BUF(buf, len, c);
	cur += l;
	c = CUR_SCHAR(cur, l);
	if (len >= XML_MAX_NAMELEN) { /* test bigentname.xml */
	    /*
	     * Okay someone managed to make a huge name, so he's ready to pay
	     * for the processing speed.
	     */
	    xmlChar *buffer;
	    int max = len * 2;

	    buffer = xmlMalloc(max);
	    if (buffer == NULL) {
	        xmlErrMemory(ctxt);
		return(NULL);
	    }
	    memcpy(buffer, buf, len);
	    while (xmlIsNameChar(ctxt, c)) {
		if (len + 10 > max) {
		    xmlChar *tmp;
                    int newSize;

                    newSize = xmlGrowCapacity(max, 1, 1, maxLength);
                    if (newSize < 0) {
                        xmlFatalErr(ctxt, XML_ERR_NAME_TOO_LONG, "NCName");
                        xmlFree(buffer);
                        return(NULL);
                    }
		    tmp = xmlRealloc(buffer, newSize);
		    if (tmp == NULL) {
			xmlErrMemory(ctxt);
			xmlFree(buffer);
			return(NULL);
		    }
		    buffer = tmp;
                    max = newSize;
		}
		COPY_BUF(buffer, len, c);
		cur += l;
		c = CUR_SCHAR(cur, l);
	    }
	    buffer[len] = 0;
	    *str = cur;
	    return(buffer);
	}
    }
    if (len > maxLength) {
        xmlFatalErr(ctxt, XML_ERR_NAME_TOO_LONG, "NCName");
        return(NULL);
    }
    *str = cur;
    ret = xmlStrndup(buf, len);
    if (ret == NULL)
        xmlErrMemory(ctxt);
    return(ret);
}